

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NaPNKalm.cpp
# Opt level: O0

void __thiscall
NaPNKalman::set_ss_equations(NaPNKalman *this,NaMatrix *mA,NaMatrix *mB,NaMatrix *mC)

{
  int iVar1;
  int iVar2;
  undefined4 *puVar3;
  NaMatrix *in_RCX;
  long *in_RDX;
  long *in_RSI;
  NaMatrix *in_RDI;
  
  iVar1 = (**(code **)(*in_RSI + 0x38))();
  if (iVar1 != 0) {
    iVar1 = (**(code **)(*in_RSI + 0x30))();
    if (iVar1 != 0) {
      iVar1 = (**(code **)(*in_RDX + 0x38))();
      if (iVar1 != 0) {
        iVar1 = (**(code **)(*in_RDX + 0x30))();
        if (iVar1 != 0) {
          iVar1 = (*in_RCX->_vptr_NaMatrix[7])();
          if (iVar1 != 0) {
            iVar1 = (*in_RCX->_vptr_NaMatrix[6])();
            if (iVar1 != 0) {
              iVar1 = (**(code **)(*in_RSI + 0x30))();
              iVar2 = (**(code **)(*in_RDX + 0x30))();
              if (iVar1 == iVar2) {
                iVar1 = (**(code **)(*in_RSI + 0x30))();
                iVar2 = (*in_RCX->_vptr_NaMatrix[7])();
                if (iVar1 == iVar2) {
                  NaMatrix::operator=(in_RCX,in_RDI);
                  NaMatrix::operator=(in_RCX,in_RDI);
                  NaMatrix::operator=(in_RCX,in_RDI);
                  return;
                }
              }
            }
          }
        }
      }
    }
  }
  puVar3 = (undefined4 *)__cxa_allocate_exception(4);
  *puVar3 = 2;
  __cxa_throw(puVar3,&NaException::typeinfo,0);
}

Assistant:

void
NaPNKalman::set_ss_equations (const NaMatrix& mA,
                              const NaMatrix& mB,
                              const NaMatrix& mC)
{
    if(!(mA.dim_cols() > 0 && mA.dim_rows() > 0 &&
         mB.dim_cols() > 0 && mB.dim_rows() > 0 &&
         mC.dim_cols() > 0 && mC.dim_rows() > 0 &&
         mA.dim_rows() == mB.dim_rows() &&
         mA.dim_rows() == mC.dim_cols())){
         throw(na_size_mismatch);
    }

    A = mA;
    B = mB;
    C = mC;
}